

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MakeCurrentPerfCase::createContexts(MakeCurrentPerfCase *this)

{
  deUint32 dVar1;
  deBool dVar2;
  int iVar3;
  undefined4 extraout_var;
  value_type local_30;
  EGLContext context;
  EGLint attribList [3];
  int contextNdx;
  Library *egl;
  MakeCurrentPerfCase *this_local;
  
  register0x00000000 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  for (attribList[1] = 0; attribList[1] < (this->m_spec).contextCount;
      attribList[1] = attribList[1] + 1) {
    context = (EGLContext)0x200003098;
    attribList[0] = 0x3038;
    do {
      (**stack0xffffffffffffffe8->_vptr_Library)(stack0xffffffffffffffe8,0x30a0);
      dVar1 = (*stack0xffffffffffffffe8->_vptr_Library[0x1f])();
      eglu::checkError(dVar1,"bindAPI(EGL_OPENGL_ES_API)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                       ,0x17e);
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    iVar3 = (*stack0xffffffffffffffe8->_vptr_Library[6])
                      (stack0xffffffffffffffe8,this->m_display,this->m_config,0,&context);
    local_30 = (value_type)CONCAT44(extraout_var,iVar3);
    dVar1 = (*stack0xffffffffffffffe8->_vptr_Library[0x1f])();
    eglu::checkError(dVar1,"eglCreateContext()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                     ,0x180);
    std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_contexts,&local_30);
  }
  return;
}

Assistant:

void MakeCurrentPerfCase::createContexts (void)
{
	const Library&	egl	= m_eglTestCtx.getLibrary();

	for (int contextNdx = 0; contextNdx < m_spec.contextCount; contextNdx++)
	{
		const EGLint attribList[] = {
			EGL_CONTEXT_CLIENT_VERSION, 2,
			EGL_NONE
		};

		EGLU_CHECK_CALL(egl, bindAPI(EGL_OPENGL_ES_API));
		EGLContext context = egl.createContext(m_display, m_config, EGL_NO_CONTEXT, attribList);
		EGLU_CHECK_MSG(egl, "eglCreateContext()");

		m_contexts.push_back(context);
	}
}